

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_schedule(Executor *this,Worker *worker,Node *node)

{
  pointer pBVar1;
  ulong uVar2;
  pthread_mutex_t *__mutex;
  Node *local_38;
  anon_class_16_2_3fe397bd local_30;
  
  local_30.node = &local_38;
  local_38 = node;
  if (worker->_executor != this) {
    pBVar1 = (this->_buffers)._buckets.
             super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)node %
            (ulong)(((long)(this->_buffers)._buckets.
                           super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x180);
    __mutex = (pthread_mutex_t *)(pBVar1 + uVar2);
    std::mutex::lock((mutex *)&__mutex->__data);
    UnboundedTaskQueue<tf::Node_*>::push
              (&(this->_buffers)._buckets.
                super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2].queue,node);
    pthread_mutex_unlock(__mutex);
    NonblockingNotifierV2::_notify<false>(&this->_notifier);
    return;
  }
  local_30.this = this;
  BoundedTaskQueue<tf::Node*,8ul>::
  push<tf::Node*&,tf::Executor::_schedule(tf::Worker&,tf::Node*)::_lambda()_1_>
            ((BoundedTaskQueue<tf::Node*,8ul> *)&worker->_wsq,&local_38,&local_30);
  NonblockingNotifierV2::_notify<false>(&this->_notifier);
  return;
}

Assistant:

inline void Executor::_schedule(Worker& worker, Node* node) {
  
  // caller is a worker to this pool - starting at v3.5 we do not use
  // any complicated notification mechanism as the experimental result
  // has shown no significant advantage.
  if(worker._executor == this) {
    worker._wsq.push(node, [&](){ _buffers.push(node); });
    _notifier.notify_one();
    return;
  }
  
  // go through the centralized queue
  _buffers.push(node);
  _notifier.notify_one();
}